

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O3

bool tcu::bilinearCompare
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
               PixelBufferAccess *errorMask,RGBA threshold)

{
  bool bVar1;
  int iVar2;
  InternalError *this;
  bool bVar3;
  int y;
  int iVar4;
  string local_58;
  
  if (((reference->m_format).order == RGBA) && ((reference->m_format).type == UNORM_INT8)) {
    local_58._M_dataplus._M_p = (pointer)0x3f80000000000000;
    local_58._M_string_length = 0x3f80000000000000;
    clear(errorMask,(Vec4 *)&local_58);
    iVar4 = (reference->m_size).m_data[1];
    if (iVar4 < 1) {
      bVar3 = true;
    }
    else {
      iVar2 = (reference->m_size).m_data[0];
      y = 0;
      bVar3 = true;
      do {
        if (0 < iVar2) {
          iVar4 = 0;
          do {
            bVar1 = anon_unknown_0::comparePixelRGBA8
                              ((anon_unknown_0 *)reference,
                               (ConstPixelBufferAccess *)(ulong)(uint)(result->m_pitch).m_data[1],
                               (ConstPixelBufferAccess *)result->m_data,threshold,iVar4,y);
            if ((!bVar1) &&
               (bVar1 = anon_unknown_0::comparePixelRGBA8
                                  ((anon_unknown_0 *)result,
                                   (ConstPixelBufferAccess *)
                                   (ulong)(uint)(reference->m_pitch).m_data[1],
                                   (ConstPixelBufferAccess *)reference->m_data,threshold,iVar4,y),
               !bVar1)) {
              local_58._M_dataplus._M_p = (pointer)0x3f800000;
              local_58._M_string_length = 0x3f80000000000000;
              bVar3 = false;
              PixelBufferAccess::setPixel(errorMask,(Vec4 *)&local_58,iVar4,y,0);
            }
            iVar4 = iVar4 + 1;
            iVar2 = (reference->m_size).m_data[0];
          } while (iVar4 < iVar2);
          iVar4 = (reference->m_size).m_data[1];
        }
        y = y + 1;
      } while (y < iVar4);
    }
    return bVar3;
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Unsupported format for bilinear comparison","");
  InternalError::InternalError(this,&local_58);
  __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
}

Assistant:

bool bilinearCompare (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const PixelBufferAccess& errorMask, const RGBA threshold)
{
	DE_ASSERT(reference.getWidth()	== result.getWidth()	&&
			  reference.getHeight()	== result.getHeight()	&&
			  reference.getDepth()	== result.getDepth()	&&
			  reference.getFormat()	== result.getFormat());
	DE_ASSERT(reference.getWidth()	== errorMask.getWidth()		&&
			  reference.getHeight()	== errorMask.getHeight()	&&
			  reference.getDepth()	== errorMask.getDepth());

	if (reference.getFormat() == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
		return bilinearCompareRGBA8(reference, result, errorMask, threshold);
	else
		throw InternalError("Unsupported format for bilinear comparison");
}